

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O3

void __thiscall gulcalc::itemoutputgul(gulcalc *this,gulitemSampleslevel *gg)

{
  OASIS_FLOAT OVar1;
  _func_void_void_ptr_int_int *p_Var2;
  uchar *puVar3;
  int iVar4;
  _func_void_void_ptr_int_int *p_Var5;
  int iVar6;
  
  p_Var2 = this->itemWriter_;
  p_Var5 = this->lossWriter_;
  if (p_Var2 != (_func_void_void_ptr_int_int *)0x0 || p_Var5 != (_func_void_void_ptr_int_int *)0x0)
  {
    iVar6 = this->itembufoffset_;
    if (15999 < iVar6) {
      if (p_Var2 != (_func_void_void_ptr_int_int *)0x0) {
        (*p_Var2)(this->ibuf_,1,iVar6);
        p_Var5 = this->lossWriter_;
      }
      if (p_Var5 != (_func_void_void_ptr_int_int *)0x0) {
        (*p_Var5)(this->ibuf_,1,this->itembufoffset_);
      }
      this->itembufoffset_ = 0;
      iVar6 = 0;
    }
    iVar4 = gg->event_id;
    if ((iVar4 != lastitemheader.event_id) || (gg->item_id != lastitemheader.item_id)) {
      if (this->isFirstItemEvent_ == false) {
        puVar3 = this->ibuf_ + iVar6;
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        puVar3[4] = '\0';
        puVar3[5] = '\0';
        puVar3[6] = '\0';
        puVar3[7] = '\0';
        iVar6 = this->itembufoffset_ + 8;
        this->itembufoffset_ = iVar6;
        iVar4 = gg->event_id;
      }
      else {
        this->isFirstItemEvent_ = false;
      }
      lastitemheader.item_id = gg->item_id;
      lastitemheader.event_id = iVar4;
      *(ulong *)(this->ibuf_ + iVar6) = CONCAT44(lastitemheader.item_id,iVar4);
      iVar6 = this->itembufoffset_ + 8;
      this->itembufoffset_ = iVar6;
    }
    OVar1 = gg->loss;
    puVar3 = this->ibuf_;
    *(int *)(puVar3 + iVar6) = gg->sidx;
    *(OASIS_FLOAT *)(puVar3 + (long)iVar6 + 4) = OVar1;
    this->itembufoffset_ = this->itembufoffset_ + 8;
  }
  return;
}

Assistant:

void gulcalc::itemoutputgul(gulitemSampleslevel &gg)
{
	if (itemWriter_ == 0 && lossWriter_ == 0)  return;
	if (itembufoffset_ >= bufsize) {
		if (itemWriter_) itemWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
		if (lossWriter_) lossWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
		itembufoffset_ = 0;
	}

	if (gg.event_id != lastitemheader.event_id || gg.item_id != lastitemheader.item_id) {
		if (isFirstItemEvent_ == false){
			gulSampleslevelRec r;
			r.sidx = 0;
			r.loss = 0;
			memcpy(ibuf_ + itembufoffset_, &r, sizeof(gulSampleslevelRec));
			itembufoffset_ += sizeof(gulSampleslevelRec);	// null terminate list
		}
		else {
			isFirstItemEvent_ = false;
		}
		lastitemheader.event_id = gg.event_id;
		lastitemheader.item_id = gg.item_id;
		memcpy(ibuf_ + itembufoffset_, &lastitemheader, sizeof(lastitemheader));
		itembufoffset_ += sizeof(lastitemheader);
	}

	gulSampleslevelRec r;
	r.sidx = gg.sidx;
	r.loss = gg.loss;    
	memcpy(ibuf_ + itembufoffset_, &r, sizeof(gulSampleslevelRec));
	itembufoffset_ += sizeof(gulSampleslevelRec);

}